

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3Fts3PendingTermsClear(Fts3Table *p)

{
  Fts3Index *pFVar1;
  Fts3HashElem *pFVar2;
  long lVar3;
  
  if (0 < p->nIndex) {
    lVar3 = 0;
    do {
      pFVar1 = p->aIndex;
      for (pFVar2 = pFVar1[lVar3].hPending.first; pFVar2 != (Fts3HashElem *)0x0;
          pFVar2 = pFVar2->next) {
        sqlite3_free(pFVar2->data);
      }
      sqlite3Fts3HashClear(&pFVar1[lVar3].hPending);
      lVar3 = lVar3 + 1;
    } while (lVar3 < p->nIndex);
  }
  p->nPendingData = 0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Fts3PendingTermsClear(Fts3Table *p){
  int i;
  for(i=0; i<p->nIndex; i++){
    Fts3HashElem *pElem;
    Fts3Hash *pHash = &p->aIndex[i].hPending;
    for(pElem=fts3HashFirst(pHash); pElem; pElem=fts3HashNext(pElem)){
      PendingList *pList = (PendingList *)fts3HashData(pElem);
      fts3PendingListDelete(pList);
    }
    fts3HashClear(pHash);
  }
  p->nPendingData = 0;
}